

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node * lyd_parse_path(ly_ctx *ctx,char *path,LYD_FORMAT format,int options,...)

{
  char in_AL;
  int fd_00;
  int *piVar1;
  char *pcVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined1 local_58 [8];
  va_list ap;
  lyd_node *ret;
  int fd;
  int options_local;
  LYD_FORMAT format_local;
  char *path_local;
  ly_ctx *ctx_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_e8 = in_R8;
  local_e0 = in_R9;
  if ((ctx == (ly_ctx *)0x0) || (path == (char *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_parse_path");
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    fd_00 = open(path,0);
    if (fd_00 == -1) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      ly_log(ctx,LY_LLERR,LY_ESYS,"Failed to open data file \"%s\" (%s).",path,pcVar2);
      ctx_local = (ly_ctx *)0x0;
    }
    else {
      ap[0].overflow_arg_area = local_108;
      ap[0]._0_8_ = &stack0x00000008;
      local_58._4_4_ = 0x30;
      local_58._0_4_ = 0x20;
      ctx_local = (ly_ctx *)lyd_parse_fd_(ctx,fd_00,format,options,(__va_list_tag *)local_58);
      close(fd_00);
    }
  }
  return (lyd_node *)ctx_local;
}

Assistant:

lyd_node *
lyd_parse_path(struct ly_ctx *ctx, const char *path, LYD_FORMAT format, int options, ...)
{
    int fd;
    struct lyd_node *ret;
    va_list ap;

    if (!ctx || !path) {
        LOGARG;
        return NULL;
    }

    fd = open(path, O_RDONLY);
    if (fd == -1) {
        LOGERR(ctx, LY_ESYS, "Failed to open data file \"%s\" (%s).", path, strerror(errno));
        return NULL;
    }

    va_start(ap, options);
    ret = lyd_parse_fd_(ctx, fd, format, options, ap);

    va_end(ap);
    close(fd);

    return ret;
}